

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::pollController(RemotelyControlledSampler *this)

{
  cv_status cVar1;
  long lVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  
  if (this->_running == true) {
    do {
      updateSampler(this);
      local_40._M_owns = false;
      local_40._M_device = &this->_mutex;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_30.__d.__r = (duration)(lVar2 + (this->_samplingRefreshInterval).__r);
      do {
        if (this->_running != true) break;
        cVar1 = std::condition_variable::
                __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          (&this->_shutdownCV,&local_40,&local_30);
      } while (cVar1 != timeout);
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
    } while (this->_running != false);
  }
  return;
}

Assistant:

void RemotelyControlledSampler::pollController()
{
    while (_running) {
        updateSampler();
        std::unique_lock<std::mutex> lock(_mutex);
        _shutdownCV.wait_for(
            lock, _samplingRefreshInterval, [this]() { return !_running; });
    }
}